

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall
rlottie::internal::renderer::ImageLayer::ImageLayer(ImageLayer *this,Layer *layerData)

{
  Asset *pAVar1;
  Layer *in_RDI;
  VBrush brush;
  Asset *in_stack_ffffffffffffffc8;
  Layer *in_stack_ffffffffffffffd8;
  anon_union_8_3_adf75f03_for_VBrush_2 in_stack_ffffffffffffffe0;
  
  Layer::Layer((Layer *)in_stack_ffffffffffffffe0.mGradient,in_stack_ffffffffffffffd8);
  (((VDrawable *)&in_RDI->super_Group)->mPath).d.mModel = (model *)&PTR__ImageLayer_001b5c08;
  Drawable::Drawable((Drawable *)in_RDI);
  VTexture::VTexture((VTexture *)in_RDI);
  VPath::VPath((VPath *)0x161040);
  in_RDI[2].super_Group.mChildren.
  super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RDI[2].super_Group.mChildren.
  super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&in_RDI->mExtra;
  pAVar1 = internal::model::Layer::asset(in_RDI);
  if (pAVar1 != (Asset *)0x0) {
    internal::model::Layer::asset(in_RDI);
    internal::model::Asset::bitmap(in_stack_ffffffffffffffc8);
    VBitmap::operator=((VBitmap *)in_RDI,(VBitmap *)in_stack_ffffffffffffffc8);
    VBitmap::~VBitmap((VBitmap *)0x1610aa);
    VBrush::VBrush((VBrush *)&stack0xffffffffffffffd8,(VTexture *)&in_RDI[1].mLayerSize.mh);
    VDrawable::setBrush((VDrawable *)&in_RDI->mExtra,(VBrush *)&stack0xffffffffffffffd8);
  }
  return;
}

Assistant:

renderer::ImageLayer::ImageLayer(model::Layer *layerData)
    : renderer::Layer(layerData)
{
    mDrawableList = &mRenderNode;

    if (!mLayerData->asset()) return;

    mTexture.mBitmap = mLayerData->asset()->bitmap();
    VBrush brush(&mTexture);
    mRenderNode.setBrush(brush);
}